

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O0

uint32_t xmlDictComputeBigKey(xmlChar *data,int namelen,int seed)

{
  int local_28;
  uint local_24;
  int i;
  uint32_t hash;
  int seed_local;
  int namelen_local;
  xmlChar *data_local;
  
  if ((namelen < 1) || (data == (xmlChar *)0x0)) {
    data_local._4_4_ = 0;
  }
  else {
    local_24 = seed;
    for (local_28 = 0; local_28 < namelen; local_28 = local_28 + 1) {
      local_24 = (data[local_28] + local_24) * 0x401;
      local_24 = local_24 >> 6 ^ local_24;
    }
    data_local._4_4_ = (local_24 * 9 >> 0xb ^ local_24 * 9) * 0x8001;
  }
  return data_local._4_4_;
}

Assistant:

static uint32_t
xmlDictComputeBigKey(const xmlChar* data, int namelen, int seed) {
    uint32_t hash;
    int i;

    if (namelen <= 0 || data == NULL) return(0);

    hash = seed;

    for (i = 0;i < namelen; i++) {
        hash += data[i];
	hash += (hash << 10);
	hash ^= (hash >> 6);
    }
    hash += (hash << 3);
    hash ^= (hash >> 11);
    hash += (hash << 15);

    return hash;
}